

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  int __errnum;
  protobuf *this_00;
  _Base_ptr p_Var1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  size_t sVar6;
  ostream *poVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  void *__buf;
  int error;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  StringPiece full;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Base_ptr local_68;
  uint local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_40;
  _Base_ptr local_38;
  
  if (this->had_error_ == false) {
    if ((prefix->_M_string_length == 0) ||
       (iVar3 = access((prefix->_M_dataplus)._M_p,0), iVar3 != -1)) {
      local_68 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_38 = &(this->files_)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar14 = local_68 == local_38;
      uVar13 = CONCAT71((int7)((ulong)local_68 >> 8),bVar14);
      local_40 = prefix;
      while (!bVar14) {
        local_5c = (uint)uVar13;
        __buf = *(void **)(local_68 + 2);
        uVar10 = *(uint *)&local_68[2]._M_parent;
        this_00 = *(protobuf **)(local_68 + 1);
        p_Var1 = local_68[1]._M_parent;
        if ((long)p_Var1 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)p_Var1,"string length exceeds max size");
        }
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        full.length_ = (size_type)"/\\";
        full.ptr_ = (char *)p_Var1;
        SplitStringUsing(this_00,full,(char *)&local_58,in_R8);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar2 = (local_40->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar2,pcVar2 + local_40->_M_string_length);
        bVar14 = (long)local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0x20;
        if (!bVar14) {
          lVar12 = 8;
          uVar13 = 0;
          do {
            std::__cxx11::string::_M_append
                      ((char *)&local_88,
                       *(ulong *)((long)local_58.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8));
            iVar3 = mkdir(local_88._M_dataplus._M_p,0x1ff);
            if ((iVar3 != 0) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,*(char **)(local_68 + 1),
                                  (long)local_68[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,": while trying to create directory ",0x23);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,local_88._M_dataplus._M_p,local_88._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
              pcVar8 = strerror(*piVar4);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
              }
              else {
                sVar6 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar6);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              break;
            }
            std::__cxx11::string::push_back((char)&local_88);
            uVar13 = uVar13 + 1;
            uVar9 = ((long)local_58.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
            lVar12 = lVar12 + 0x20;
            bVar14 = uVar9 <= uVar13;
          } while (uVar13 < uVar9);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
        if (!bVar14) {
LAB_0022f90c:
          uVar13 = (ulong)local_5c;
          break;
        }
        std::operator+(&local_88,local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_68 + 1));
        while (iVar3 = open(local_88._M_dataplus._M_p,0x241,0x1b6), iVar3 < 0) {
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          if (iVar3 != 4) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                                local_88._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
            pcVar8 = strerror(iVar3);
            std::operator<<(poVar7,pcVar8);
            goto LAB_0022f8f9;
          }
        }
        while (0 < (int)uVar10) {
          do {
            sVar5 = write(iVar3,__buf,(ulong)uVar10);
            uVar11 = (uint)sVar5;
            if (-1 < (int)uVar11) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
          if ((int)uVar11 < 1) {
            if ((int)uVar11 < 0) {
              piVar4 = __errno_location();
              __errnum = *piVar4;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                                  local_88._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,": write: ",9);
              pcVar8 = strerror(__errnum);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
              }
              else {
                sVar6 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar6);
              }
            }
            else {
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                                  local_88._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,": write() returned zero?",0x18);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
          }
          else {
            __buf = (void *)((long)__buf + (ulong)(uVar11 & 0x7fffffff));
            uVar10 = uVar10 - uVar11;
          }
          if ((int)uVar11 < 1) goto LAB_0022f8f9;
        }
        iVar3 = close(iVar3);
        p_Var1 = local_38;
        if (iVar3 != 0) {
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_88._M_dataplus._M_p,
                              local_88._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": close: ",9);
          pcVar8 = strerror(iVar3);
          std::operator<<(poVar7,pcVar8);
LAB_0022f8f9:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          goto LAB_0022f90c;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        local_68 = (_Base_ptr)std::_Rb_tree_increment(local_68);
        bVar14 = local_68 == p_Var1;
        uVar13 = CONCAT71((int7)((ulong)local_68 >> 8),bVar14);
      }
      goto LAB_0022f910;
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    piVar4 = __errno_location();
    pcVar8 = strerror(*piVar4);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
    }
    else {
      sVar6 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  uVar13 = 0;
LAB_0022f910:
  return (bool)((byte)uVar13 & 1);
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const std::string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (const auto& pair : files_) {
    const std::string& relative_filename = pair.first;
    const char* data = pair.second.data();
    int size = pair.second.size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    std::string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
          open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}